

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O1

void __thiscall
cmsys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,vector<int,_std::allocator<int>_> *variable,string *value)

{
  iterator __position;
  long lVar1;
  char *res;
  int local_14;
  char *local_10;
  
  local_10 = (char *)0x0;
  lVar1 = strtol((value->_M_dataplus)._M_p,&local_10,10);
  local_14 = (int)lVar1;
  __position._M_current =
       (variable->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (variable->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(variable,__position,&local_14);
  }
  else {
    *__position._M_current = local_14;
    (variable->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(std::vector<int>* variable,
                                            const std::string& value)
{
  char* res = KWSYS_NULLPTR;
  variable->push_back(static_cast<int>(strtol(value.c_str(), &res, 10)));
  // if ( res && *res )
  //  {
  //  Can handle non-int
  //  }
}